

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_dup_to_ctx(lyd_node *node,int recursive,ly_ctx *ctx)

{
  LYS_NODE LVar1;
  int iVar2;
  LY_ERR *pLVar3;
  char *pcVar4;
  lyd_node *plVar5;
  lyxml_elem *plVar6;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_90;
  ly_ctx *local_80;
  ly_ctx *local_78;
  lyd_node_anydata *old_any;
  lyd_node_anydata *new_any;
  lyd_node_leaf_list *new_leaf;
  lyd_node *new_node;
  lyd_node *parent;
  lyd_node *ret;
  lyd_node *elem;
  lyd_node *next;
  ly_ctx *ctx_local;
  int recursive_local;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    node_local = (lyd_node *)0x0;
  }
  else {
    next = (lyd_node *)ctx;
    if (ctx == node->schema->module->ctx) {
      next = (lyd_node *)0x0;
    }
    parent = (lyd_node *)0x0;
    new_node = (lyd_node *)0x0;
    ret = node;
    while (new_leaf = (lyd_node_leaf_list *)0x0, ret != (lyd_node *)0x0) {
      LVar1 = ret->schema->nodetype;
      if (LVar1 == LYS_CONTAINER) {
LAB_00189ac9:
        new_leaf = (lyd_node_leaf_list *)calloc(1,0x38);
        if (new_leaf == (lyd_node_leaf_list *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_to_ctx");
LAB_00189c74:
          if ((new_leaf == (lyd_node_leaf_list *)0x0) || (new_leaf->schema == (lys_node *)0x0)) {
            free(new_leaf);
          }
          else {
            lyd_free((lyd_node *)new_leaf);
          }
          lyd_free(parent);
          return (lyd_node *)0x0;
        }
        new_leaf->value_str = (char *)0x0;
        iVar2 = lyd_dup_common(new_node,(lyd_node *)new_leaf,ret,(ly_ctx *)next);
        if (iVar2 != 0) goto LAB_00189c74;
      }
      else {
        if ((LVar1 != LYS_LEAF) && (LVar1 != LYS_LEAFLIST)) {
          if (LVar1 != LYS_LIST) {
            if (LVar1 != LYS_ANYXML) {
              if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_ACTION))
              goto LAB_00189ac9;
              if (LVar1 != LYS_ANYDATA) {
                pLVar3 = ly_errno_location();
                *pLVar3 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                       ,0x122c);
                goto LAB_00189c74;
              }
            }
            new_leaf = (lyd_node_leaf_list *)calloc(1,0x40);
            if (new_leaf == (lyd_node_leaf_list *)0x0) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_to_ctx");
              goto LAB_00189c74;
            }
            iVar2 = lyd_dup_common(new_node,(lyd_node *)new_leaf,ret,(ly_ctx *)next);
            if (iVar2 != 0) goto LAB_00189c74;
            *(undefined4 *)&new_leaf->value_str = *(undefined4 *)&ret->child;
            if (ret[1].schema != (lys_node *)0x0) {
              switch(*(undefined4 *)&ret->child) {
              case 0:
              case 2:
              case 4:
                if (next == (lyd_node *)0x0) {
                  local_a0 = ret->schema->module->ctx;
                }
                else {
                  local_a0 = (ly_ctx *)next;
                }
                pcVar4 = lydict_insert(local_a0,(char *)ret[1].schema,0);
                (new_leaf->value).binary = pcVar4;
                break;
              case 1:
              case 3:
              case 5:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                              ,0x1217,
                              "struct lyd_node *lyd_dup_to_ctx(const struct lyd_node *, int, struct ly_ctx *)"
                             );
              case 8:
                if (next == (lyd_node *)0x0) {
                  local_a8 = ret->schema->module->ctx;
                }
                else {
                  local_a8 = (ly_ctx *)next;
                }
                plVar6 = lyxml_dup_elem(local_a8,(lyxml_elem *)ret[1].schema,(lyxml_elem *)0x0,1);
                (new_leaf->value).enm = (lys_type_enum *)plVar6;
                break;
              case 0x10:
                plVar5 = lyd_dup_to_ctx((lyd_node *)ret[1].schema,1,(ly_ctx *)next);
                (new_leaf->value).instance = plVar5;
              }
            }
            goto LAB_00189b63;
          }
          goto LAB_00189ac9;
        }
        new_leaf = (lyd_node_leaf_list *)calloc(1,0x48);
        if (new_leaf == (lyd_node_leaf_list *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_to_ctx");
          goto LAB_00189c74;
        }
        if (next == (lyd_node *)0x0) {
          local_78 = ret->schema->module->ctx;
        }
        else {
          local_78 = (ly_ctx *)next;
        }
        pcVar4 = lydict_insert(local_78,(char *)ret->child,0);
        new_leaf->value_str = pcVar4;
        new_leaf->value_type = *(uint16_t *)&ret[1].validity;
        iVar2 = lyd_dup_common(new_node,(lyd_node *)new_leaf,ret,(ly_ctx *)next);
        if (iVar2 != 0) {
          if (new_leaf->schema == (lys_node *)0x0) {
            if (next == (lyd_node *)0x0) {
              local_80 = ret->schema->module->ctx;
            }
            else {
              local_80 = (ly_ctx *)next;
            }
            lydict_remove(local_80,new_leaf->value_str);
          }
          goto LAB_00189c74;
        }
        switch(new_leaf->value_type) {
        case 1:
        case 10:
          new_leaf->value = (lyd_val)new_leaf->value_str;
          break;
        case 2:
        case 7:
switchD_0018982f_caseD_2:
          lyp_parse_value((lys_type *)&new_leaf->schema[1].ref,&new_leaf->value_str,
                          (lyxml_elem *)0x0,new_leaf,(lyd_attr *)0x0,1,(uint)(node->field_0x9 & 1));
          break;
        default:
          new_leaf->value = *(lyd_val *)(ret + 1);
          break;
        case 6:
          if (next != (lyd_node *)0x0) goto switchD_0018982f_caseD_2;
          new_leaf->value = *(lyd_val *)(ret + 1);
          break;
        case 8:
          (new_leaf->value).binary = (char *)0x0;
          break;
        case 9:
          (new_leaf->value).binary = (char *)0x0;
          break;
        case 0xb:
          if (next == (lyd_node *)0x0) {
            local_90 = node->schema->module->ctx;
          }
          else {
            local_90 = (ly_ctx *)next;
          }
          pcVar4 = lydict_insert(local_90,(char *)ret[1].schema,0);
          (new_leaf->value).binary = pcVar4;
        }
      }
LAB_00189b63:
      if (parent == (lyd_node *)0x0) {
        parent = (lyd_node *)new_leaf;
      }
      if (recursive == 0) break;
      elem = ret->child;
      if ((ret->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        elem = (lyd_node *)0x0;
      }
      if (elem == (lyd_node *)0x0) {
        if (ret->parent == node->parent) break;
        elem = ret->next;
      }
      else {
        new_node = (lyd_node *)new_leaf;
      }
      new_leaf = (lyd_node_leaf_list *)0x0;
      while ((elem == (lyd_node *)0x0 && (ret = ret->parent, ret->parent != node->parent))) {
        if (new_node == (lyd_node *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x1250);
          goto LAB_00189c74;
        }
        new_node = new_node->parent;
        elem = ret->next;
      }
      ret = elem;
    }
    node_local = parent;
  }
  return node_local;
}

Assistant:

lyd_node *
lyd_dup_to_ctx(const struct lyd_node *node, int recursive, struct ly_ctx *ctx)
{
    const struct lyd_node *next, *elem;
    struct lyd_node *ret, *parent, *new_node = NULL;
    struct lyd_node_leaf_list *new_leaf;
    struct lyd_node_anydata *new_any, *old_any;

    if (!node) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (ctx == node->schema->module->ctx) {
        /* target context is actually the same as the source context,
         * ignore the target context */
        ctx = NULL;
    }

    ret = NULL;
    parent = NULL;

    /* LY_TREE_DFS */
    for (elem = next = node; elem; elem = next) {

        /* fill specific part */
        switch (elem->schema->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            new_leaf = calloc(1, sizeof *new_leaf);
            new_node = (struct lyd_node *)new_leaf;
            if (!new_node) {
                LOGMEM;
                goto error;
            }

            new_leaf->value_str = lydict_insert(ctx ? ctx : elem->schema->module->ctx,
                                                ((struct lyd_node_leaf_list *)elem)->value_str, 0);
            new_leaf->value_type = ((struct lyd_node_leaf_list *)elem)->value_type;
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                if (!new_node->schema) {
                    /* in error cleanup, just free will be called instead of lyd_free(),
                     * so do the additional cleanup here */
                    lydict_remove(ctx ? ctx : elem->schema->module->ctx, new_leaf->value_str);
                }
                goto error;
            }

            switch (new_leaf->value_type) {
            case LY_TYPE_BINARY:
            case LY_TYPE_STRING:
                /* value_str pointer is shared in these cases */
                new_leaf->value.string = new_leaf->value_str;
                break;
            case LY_TYPE_LEAFREF:
                new_leaf->value.leafref = NULL;
                break;
            case LY_TYPE_INST:
                new_leaf->value.instance = NULL;
                break;
            case LY_TYPE_UNION:
                /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
                 * because of possible change of the value in case of instance-identifier) */
                new_leaf->value.string = lydict_insert(ctx ? ctx : node->schema->module->ctx,
                                                       ((struct lyd_node_leaf_list *)elem)->value.string, 0);
                break;
            case LY_TYPE_ENUM:
                if (!ctx) {
                    /* we are still in the same context - just copy the data */
                    new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                    break;
                }
                /* no break */
            case LY_TYPE_IDENT:
            case LY_TYPE_BITS:
                /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
                 * a different context, searching for the type and duplicating the data is almost as same as resolving
                 * the string value, so due to a simplicity, parse the value for the duplicated leaf */
                lyp_parse_value(&((struct lys_node_leaf *)new_leaf->schema)->type, &new_leaf->value_str, NULL,
                                new_leaf, NULL, 1, node->dflt);
                break;
            default:
                new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                break;
            }
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            old_any = (struct lyd_node_anydata *)elem;
            new_any = calloc(1, sizeof *new_any);
            new_node = (struct lyd_node *)new_any;
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }

            new_any->value_type = old_any->value_type;
            if (!(void*)old_any->value.tree) {
                /* no value to duplicate */
                break;
            }
            /* duplicate the value */
            switch (old_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                new_any->value.str = lydict_insert(ctx ? ctx : elem->schema->module->ctx, old_any->value.str, 0);
                break;
            case LYD_ANYDATA_DATATREE:
                new_any->value.tree = lyd_dup_to_ctx(old_any->value.tree, 1, ctx);
                break;
            case LYD_ANYDATA_XML:
                new_any->value.xml = lyxml_dup_elem(ctx ? ctx : elem->schema->module->ctx, old_any->value.xml, NULL, 1);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            new_node = calloc(1, sizeof *new_node);
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            new_node->child = NULL;

            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }
            break;
        default:
            LOGINT;
            goto error;
        }
        if (!ret) {
            ret = new_node;
        }

        if (!recursive) {
            break;
        }

        /* LY_TREE_DFS_END */
        /* select element for the next run - children first */
        next = elem->child;
        /* child exception for lyd_node_leaf and lyd_node_leaflist */
        if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next = NULL;
        }
        if (!next) {
            if (elem->parent == node->parent) {
                break;
            }
            /* no children, so try siblings */
            next = elem->next;
        } else {
            parent = new_node;
        }
        new_node = NULL;

        while (!next) {
            /* no siblings, go back through parents */
            elem = elem->parent;
            if (elem->parent == node->parent) {
                break;
            }
            if (!parent) {
                LOGINT;
                goto error;
            }
            parent = parent->parent;
            /* parent is already processed, go to its sibling */
            next = elem->next;
        }
    }

    return ret;

error:
    if (new_node && new_node->schema) {
        lyd_free(new_node);
    } else {
        free(new_node);
    }
    lyd_free(ret);
    return NULL;
}